

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O1

int ssyrk_(char *uplo,char *trans,integer *n,integer *k,real *alpha,real *a,integer *lda,real *beta,
          real *c__,integer *ldc)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  logical lVar5;
  logical lVar6;
  integer iVar7;
  ulong uVar8;
  real *prVar9;
  ulong uVar10;
  long lVar11;
  real *prVar12;
  long lVar13;
  real *prVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  integer *piVar19;
  ulong uVar20;
  ulong uVar21;
  size_t __n;
  ulong uVar22;
  float fVar23;
  
  uVar16 = (ulong)*lda;
  iVar2 = *ldc;
  uVar8 = (ulong)iVar2;
  lVar5 = lsame_(trans,"N");
  piVar19 = n;
  if (lVar5 == 0) {
    piVar19 = k;
  }
  iVar15 = *piVar19;
  lVar5 = lsame_(uplo,"U");
  ssyrk_::info = 0;
  if ((lVar5 == 0) && (lVar6 = lsame_(uplo,"L"), lVar6 == 0)) {
    iVar7 = 1;
  }
  else {
    lVar6 = lsame_(trans,"N");
    if ((lVar6 == 0) &&
       ((lVar6 = lsame_(trans,"T"), lVar6 == 0 && (lVar6 = lsame_(trans,"C"), lVar6 == 0)))) {
      iVar7 = 2;
    }
    else {
      iVar3 = *n;
      if (iVar3 < 0) {
        iVar7 = 3;
      }
      else if (*k < 0) {
        iVar7 = 4;
      }
      else {
        if (iVar15 < 2) {
          iVar15 = 1;
        }
        iVar7 = 7;
        if (iVar15 <= *lda) {
          iVar15 = 1;
          if (1 < iVar3) {
            iVar15 = iVar3;
          }
          iVar7 = 10;
          if (iVar15 <= *ldc) goto LAB_00111ba5;
        }
      }
    }
  }
  ssyrk_::info = iVar7;
LAB_00111ba5:
  if (ssyrk_::info == 0) {
    uVar4 = *n;
    uVar21 = (ulong)uVar4;
    if (uVar21 != 0) {
      fVar23 = *alpha;
      if ((((fVar23 != 0.0) || (NAN(fVar23))) && (*k != 0)) || ((*beta != 1.0 || (NAN(*beta))))) {
        uVar22 = ~uVar8;
        if ((fVar23 != 0.0) || (NAN(fVar23))) {
          uVar20 = ~uVar16;
          lVar6 = lsame_(trans,"N");
          uVar4 = *n;
          uVar21 = (ulong)uVar4;
          if (lVar6 == 0) {
            if (lVar5 == 0) {
              if (0 < (int)uVar4) {
                iVar2 = *k;
                prVar9 = a + uVar20 + uVar16;
                uVar20 = 1;
                do {
                  prVar12 = prVar9;
                  uVar18 = uVar20;
                  do {
                    fVar23 = 0.0;
                    if (0 < iVar2) {
                      uVar10 = 1;
                      do {
                        fVar23 = fVar23 + prVar12[uVar10] * prVar9[uVar10];
                        uVar10 = uVar10 + 1;
                      } while (iVar2 + 1 != uVar10);
                    }
                    fVar1 = *beta;
                    if ((fVar1 != 0.0) || (NAN(fVar1))) {
                      c__[uVar22 + uVar20 * uVar8 + uVar18] =
                           *alpha * fVar23 + fVar1 * c__[uVar22 + uVar20 * uVar8 + uVar18];
                    }
                    else {
                      c__[uVar22 + uVar20 * uVar8 + uVar18] = *alpha * fVar23;
                    }
                    uVar18 = uVar18 + 1;
                    prVar12 = prVar12 + uVar16;
                  } while (uVar18 != (uVar21 + 1 & 0xffffffff));
                  uVar20 = uVar20 + 1;
                  prVar9 = prVar9 + uVar16;
                } while (uVar20 != uVar21 + 1);
              }
            }
            else if (0 < (int)uVar4) {
              iVar2 = *k;
              lVar11 = 2;
              lVar13 = 1;
              prVar9 = a + uVar20 + uVar16;
              do {
                lVar17 = 1;
                prVar12 = a + uVar20 + uVar16;
                do {
                  fVar23 = 0.0;
                  if (0 < iVar2) {
                    uVar18 = 1;
                    do {
                      fVar23 = fVar23 + prVar12[uVar18] * prVar9[uVar18];
                      uVar18 = uVar18 + 1;
                    } while (iVar2 + 1 != uVar18);
                  }
                  fVar1 = *beta;
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    fVar23 = *alpha * fVar23 + fVar1 * c__[uVar22 + lVar13 * uVar8 + lVar17];
                  }
                  else {
                    fVar23 = *alpha * fVar23;
                  }
                  c__[uVar22 + lVar13 * uVar8 + lVar17] = fVar23;
                  lVar17 = lVar17 + 1;
                  prVar12 = prVar12 + uVar16;
                } while (lVar17 != lVar11);
                lVar13 = lVar13 + 1;
                lVar11 = lVar11 + 1;
                prVar9 = prVar9 + uVar16;
              } while (lVar13 != uVar21 + 1);
            }
          }
          else if (lVar5 == 0) {
            if (0 < (int)uVar4) {
              iVar15 = *k;
              lVar11 = uVar21 + 1;
              prVar9 = c__ + uVar8 + uVar22;
              prVar12 = a + uVar16 + uVar20;
              lVar13 = 1;
              uVar18 = 0;
              do {
                fVar23 = *beta;
                if ((fVar23 != 0.0) || (NAN(fVar23))) {
                  if ((fVar23 != 1.0) || (NAN(fVar23))) {
                    lVar17 = 1;
                    do {
                      prVar9[lVar17] = *beta * prVar9[lVar17];
                      lVar17 = lVar17 + 1;
                    } while (lVar11 != lVar17);
                  }
                }
                else {
                  memset(c__ + uVar22 + (long)(int)(((uint)uVar18 + 1) * (iVar2 + 1)),0,
                         (ulong)(~(uint)uVar18 + uVar4) * 4 + 4);
                }
                if (0 < iVar15) {
                  uVar10 = 1;
                  prVar14 = prVar12;
                  do {
                    fVar23 = a[uVar20 + lVar13 + uVar10 * uVar16];
                    if ((fVar23 != 0.0) || (NAN(fVar23))) {
                      fVar1 = *alpha;
                      lVar17 = 1;
                      do {
                        prVar9[lVar17] = prVar14[lVar17] * fVar23 * fVar1 + prVar9[lVar17];
                        lVar17 = lVar17 + 1;
                      } while (lVar11 != lVar17);
                    }
                    uVar10 = uVar10 + 1;
                    prVar14 = prVar14 + uVar16;
                  } while (uVar10 != iVar15 + 1);
                }
                lVar13 = lVar13 + 1;
                uVar18 = uVar18 + 1;
                prVar9 = prVar9 + uVar8 + 1;
                lVar11 = lVar11 + -1;
                prVar12 = prVar12 + 1;
              } while (uVar18 != uVar21);
            }
          }
          else if (0 < (int)uVar4) {
            iVar15 = *k;
            prVar9 = c__ + uVar8 + uVar22 + 1;
            lVar11 = 1;
            uVar18 = 0;
            do {
              fVar23 = *beta;
              if ((fVar23 != 0.0) || (NAN(fVar23))) {
                if ((fVar23 != 1.0) || (NAN(fVar23))) {
                  lVar13 = 0;
                  do {
                    prVar9[lVar13] = *beta * prVar9[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar11 != lVar13);
                }
              }
              else {
                memset(c__ + uVar22 + (long)((int)uVar18 * iVar2 + iVar2 + 1),0,uVar18 * 4 + 4);
              }
              if (0 < iVar15) {
                uVar10 = 1;
                prVar12 = a + uVar16 + uVar20 + 1;
                do {
                  fVar23 = a[uVar20 + lVar11 + uVar10 * uVar16];
                  if ((fVar23 != 0.0) || (NAN(fVar23))) {
                    fVar1 = *alpha;
                    lVar13 = 0;
                    do {
                      prVar9[lVar13] = prVar12[lVar13] * fVar23 * fVar1 + prVar9[lVar13];
                      lVar13 = lVar13 + 1;
                    } while (lVar11 != lVar13);
                  }
                  uVar10 = uVar10 + 1;
                  prVar12 = prVar12 + uVar16;
                } while (uVar10 != iVar15 + 1);
              }
              lVar11 = lVar11 + 1;
              uVar18 = uVar18 + 1;
              prVar9 = prVar9 + uVar8;
            } while (uVar18 != uVar21);
          }
        }
        else {
          fVar23 = *beta;
          if (lVar5 == 0) {
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
              if (0 < (int)uVar4) {
                prVar9 = c__ + uVar8 + uVar22;
                lVar13 = 1;
                lVar11 = uVar21 + 1;
                do {
                  lVar17 = 1;
                  do {
                    prVar9[lVar17] = *beta * prVar9[lVar17];
                    lVar17 = lVar17 + 1;
                  } while (lVar11 != lVar17);
                  lVar13 = lVar13 + 1;
                  prVar9 = prVar9 + uVar8 + 1;
                  lVar11 = lVar11 + -1;
                } while (lVar13 != uVar21 + 1);
              }
            }
            else if (0 < (int)uVar4) {
              iVar15 = iVar2 + 1;
              do {
                uVar21 = uVar21 - 1;
                memset(c__ + uVar22 + (long)iVar15,0,(uVar21 & 0xffffffff) * 4 + 4);
                iVar15 = iVar15 + iVar2 + 1;
              } while (uVar21 != 0);
            }
          }
          else if ((fVar23 != 0.0) || (NAN(fVar23))) {
            if (0 < (int)uVar4) {
              prVar9 = c__ + uVar8 + uVar22 + 1;
              lVar11 = 1;
              do {
                lVar13 = 0;
                do {
                  prVar9[lVar13] = *beta * prVar9[lVar13];
                  lVar13 = lVar13 + 1;
                } while (lVar11 != lVar13);
                lVar11 = lVar11 + 1;
                prVar9 = prVar9 + uVar8;
              } while (lVar11 != uVar21 + 1);
            }
          }
          else if (0 < (int)uVar4) {
            prVar9 = c__ + uVar22 + (long)(iVar2 + 1);
            __n = 0;
            do {
              __n = __n + 4;
              memset(prVar9,0,__n);
              prVar9 = prVar9 + uVar8;
            } while (uVar21 << 2 != __n);
          }
        }
      }
    }
  }
  else {
    xerbla_("SSYRK ",&ssyrk_::info);
  }
  return 0;
}

Assistant:

int ssyrk_(char *uplo, char *trans, integer *n, integer *k,
	real *alpha, real *a, integer *lda, real *beta, real *c__, integer *
	ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, c_dim1, c_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, l, info;
    static real temp;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYRK  performs one of the symmetric rank k operations

       C := alpha*A*A' + beta*C,

    or

       C := alpha*A'*A + beta*C,

    where  alpha and beta  are scalars, C is an  n by n  symmetric matrix
    and  A  is an  n by k  matrix in the first case and a  k by n  matrix
    in the second case.

    Parameters
    ==========

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of the  array  C  is to be  referenced  as
             follows:

                UPLO = 'U' or 'u'   Only the  upper triangular part of  C
                                    is to be referenced.

                UPLO = 'L' or 'l'   Only the  lower triangular part of  C
                                    is to be referenced.

             Unchanged on exit.

    TRANS  - CHARACTER*1.
             On entry,  TRANS  specifies the operation to be performed as
             follows:

                TRANS = 'N' or 'n'   C := alpha*A*A' + beta*C.

                TRANS = 'T' or 't'   C := alpha*A'*A + beta*C.

                TRANS = 'C' or 'c'   C := alpha*A'*A + beta*C.

             Unchanged on exit.

    N      - INTEGER.
             On entry,  N specifies the order of the matrix C.  N must be
             at least zero.
             Unchanged on exit.

    K      - INTEGER.
             On entry with  TRANS = 'N' or 'n',  K  specifies  the number
             of  columns   of  the   matrix   A,   and  on   entry   with
             TRANS = 'T' or 't' or 'C' or 'c',  K  specifies  the  number
             of rows of the matrix  A.  K must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             k  when  TRANS = 'N' or 'n',  and is  n  otherwise.
             Before entry with  TRANS = 'N' or 'n',  the  leading  n by k
             part of the array  A  must contain the matrix  A,  otherwise
             the leading  k by n  part of the array  A  must contain  the
             matrix A.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in  the  calling  (sub)  program.   When  TRANS = 'N' or 'n'
             then  LDA must be at least  max( 1, n ), otherwise  LDA must
             be at least  max( 1, k ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry, BETA specifies the scalar beta.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry  with  UPLO = 'U' or 'u',  the leading  n by n
             upper triangular part of the array C must contain the upper
             triangular part  of the  symmetric matrix  and the strictly
             lower triangular part of C is not referenced.  On exit, the
             upper triangular part of the array  C is overwritten by the
             upper triangular part of the updated matrix.
             Before entry  with  UPLO = 'L' or 'l',  the leading  n by n
             lower triangular part of the array C must contain the lower
             triangular part  of the  symmetric matrix  and the strictly
             upper triangular part of C is not referenced.  On exit, the
             lower triangular part of the array  C is overwritten by the
             lower triangular part of the updated matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, n ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(trans, "N")) {
	nrowa = *n;
    } else {
	nrowa = *k;
    }
    upper = lsame_(uplo, "U");

    info = 0;
    if (! upper && ! lsame_(uplo, "L")) {
	info = 1;
    } else if (! lsame_(trans, "N") && ! lsame_(trans,
	    "T") && ! lsame_(trans, "C")) {
	info = 2;
    } else if (*n < 0) {
	info = 3;
    } else if (*k < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldc < max(1,*n)) {
	info = 10;
    }
    if (info != 0) {
	xerbla_("SSYRK ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || ((*alpha == 0.f || *k == 0) && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (upper) {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		    }
/* L20: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		    }
/* L40: */
		}
	    }
	} else {
	    if (*beta == 0.f) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L70: */
		    }
/* L80: */
		}
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(trans, "N")) {

/*        Form  C := alpha*A*A' + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L90: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = j;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L100: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = j;
			for (i__ = 1; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L110: */
			}
		    }
/* L120: */
		}
/* L130: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		if (*beta == 0.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = 0.f;
/* L140: */
		    }
		} else if (*beta != 1.f) {
		    i__2 = *n;
		    for (i__ = j; i__ <= i__2; ++i__) {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L150: */
		    }
		}
		i__2 = *k;
		for (l = 1; l <= i__2; ++l) {
		    if (a[j + l * a_dim1] != 0.f) {
			temp = *alpha * a[j + l * a_dim1];
			i__3 = *n;
			for (i__ = j; i__ <= i__3; ++i__) {
			    c__[i__ + j * c_dim1] += temp * a[i__ + l *
				    a_dim1];
/* L160: */
			}
		    }
/* L170: */
		}
/* L180: */
	    }
	}
    } else {

/*        Form  C := alpha*A'*A + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = j;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L190: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L200: */
		}
/* L210: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *n;
		for (i__ = j; i__ <= i__2; ++i__) {
		    temp = 0.f;
		    i__3 = *k;
		    for (l = 1; l <= i__3; ++l) {
			temp += a[l + i__ * a_dim1] * a[l + j * a_dim1];
/* L220: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = *alpha * temp;
		    } else {
			c__[i__ + j * c_dim1] = *alpha * temp + *beta * c__[
				i__ + j * c_dim1];
		    }
/* L230: */
		}
/* L240: */
	    }
	}
    }

    return 0;

/*     End of SSYRK . */

}